

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O2

bool __thiscall COLLADASaxFWL::MeshLoader::initializeOffsets(MeshLoader *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  this->mCurrentOffset = 0;
  this->mPositionsOffset = 0;
  this->mPositionsIndexOffset = 0;
  this->mUsePositions = true;
  this->mNormalsOffset = 0;
  this->mNormalsIndexOffset = 0;
  this->mUseNormals = false;
  this->mUseTangents = false;
  this->mUseBinormals = false;
  std::
  vector<COLLADASaxFWL::MeshLoader::PrimitiveInput,_std::allocator<COLLADASaxFWL::MeshLoader::PrimitiveInput>_>
  ::clear(&this->mTexCoordList);
  std::
  vector<COLLADASaxFWL::MeshLoader::PrimitiveInput,_std::allocator<COLLADASaxFWL::MeshLoader::PrimitiveInput>_>
  ::clear(&this->mColorList);
  this->mCurrentMaxOffset = (this->mMeshPrimitiveInputs).mInputArrayMaxOffset;
  bVar1 = initializePositionsOffset(this);
  initializeNormalsOffset(this);
  bVar2 = initializeColorsOffset(this);
  bVar3 = initializeTexCoordsOffset(this);
  initializeTangentsOffset(this);
  initializeBinormalsOffset(this);
  return bVar3 || (bVar2 || bVar1);
}

Assistant:

bool MeshLoader::initializeOffsets()
	{
        bool has_errors = false;
        // Reset the members
        mCurrentOffset = 0;
        mPositionsOffset = 0;
        mPositionsIndexOffset = 0;
        mUsePositions = true;
        mNormalsOffset = 0;
        mNormalsIndexOffset = 0;
        mUseNormals = false;
        mUseTangents = false;
        mUseBinormals = false;
        mTexCoordList.clear ();
        mColorList.clear ();

		// We need the maximum offset value of the input elements to calculate the 
		// number of indices for each index list.
		mCurrentMaxOffset = (size_t)mMeshPrimitiveInputs.getInputArrayMaxOffset ();

		// The offset values of the input elements.
        has_errors |= initializePositionsOffset();
        initializeNormalsOffset();
        has_errors |= initializeColorsOffset();
        has_errors |= initializeTexCoordsOffset();
        initializeTangentsOffset();
        initializeBinormalsOffset();
        return has_errors;
	}